

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestBranchInternal::Run(TestBranchInternal *this)

{
  Outputter *pOVar1;
  bool bVar2;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar3;
  reference ppBVar4;
  string *psVar5;
  char (*in_RDX) [10];
  char (*s) [8];
  char (*s_00) [8];
  undefined1 local_131 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_128;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  local_120;
  testinator local_108 [38];
  anon_class_1_0_00000001_for_m_f local_e2;
  testinator local_e1;
  undefined1 local_e0 [7];
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
  rspop404;
  BranchScope rs404;
  Cons<std::pair<testinator::Nil,_const_char_*>_> local_c0;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  local_b0;
  testinator local_98 [38];
  anon_class_1_0_00000001_for_m_f local_72;
  testinator local_71;
  undefined1 local_70 [7];
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
  rspop399;
  BranchScope rs399;
  undefined1 local_41 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_38;
  testinator local_30 [32];
  TestBranchInternal *local_10;
  TestBranchInternal *this_local;
  
  pOVar1 = (this->super_Test).m_op;
  local_41[0] = 0;
  local_10 = this;
  local_38 = testinator::operator<<
                       ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_41,
                        (Cons<testinator::Nil> *)"no branch",in_RDX);
  testinator::Diagnostic<testinator::Cons<std::pair<testinator::Nil,char_const*>>>
            (local_30,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_41 + 1));
  (*pOVar1->_vptr_Outputter[3])(pOVar1,local_30);
  std::__cxx11::string::~string((string *)local_30);
  testinator::BranchScope::BranchScope
            ((BranchScope *)local_70,399,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"A");
  bVar2 = testinator::BranchScope::canRun((BranchScope *)local_70);
  if (bVar2) {
    testinator::at_scope_exit<TestBranchInternal::Run()::_lambda()_1_>(&local_71,&local_72);
    bVar2 = testinator::AtScopeExit::operator_cast_to_bool((AtScopeExit *)&local_71);
    if (bVar2) {
      pOVar1 = (this->super_Test).m_op;
      rs404._23_1_ = 0;
      local_c0.m_list.second =
           (char *)testinator::operator<<
                             ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)&rs404.field_0x17,
                              (Cons<testinator::Nil> *)"branch ",s);
      psVar3 = testinator::Branch::getStack();
      ppBVar4 = std::
                stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
                ::top(psVar3);
      psVar5 = testinator::Branch::getName_abi_cxx11_(*ppBVar4);
      testinator::operator<<(&local_b0,&local_c0,psVar5);
      testinator::
      Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
                (local_98,&local_b0);
      (*pOVar1->_vptr_Outputter[3])(pOVar1,local_98);
      std::__cxx11::string::~string((string *)local_98);
    }
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:399:5)>
    ::~AtScopeExit((AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:399:5)>
                    *)&local_71);
  }
  testinator::BranchScope::BranchScope
            ((BranchScope *)local_e0,0x194,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"B");
  bVar2 = testinator::BranchScope::canRun((BranchScope *)local_e0);
  if (bVar2) {
    testinator::at_scope_exit<TestBranchInternal::Run()::_lambda()_2_>(&local_e1,&local_e2);
    bVar2 = testinator::AtScopeExit::operator_cast_to_bool((AtScopeExit *)&local_e1);
    if (bVar2) {
      pOVar1 = (this->super_Test).m_op;
      local_131[0] = 0;
      local_128 = testinator::operator<<
                            ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_131,
                             (Cons<testinator::Nil> *)"branch ",s_00);
      psVar3 = testinator::Branch::getStack();
      ppBVar4 = std::
                stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
                ::top(psVar3);
      psVar5 = testinator::Branch::getName_abi_cxx11_(*ppBVar4);
      testinator::operator<<
                (&local_120,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_131 + 1),
                 psVar5);
      testinator::
      Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
                (local_108,&local_120);
      (*pOVar1->_vptr_Outputter[3])(pOVar1,local_108);
      std::__cxx11::string::~string((string *)local_108);
    }
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:404:5)>
    ::~AtScopeExit((AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:404:5)>
                    *)&local_e1);
  }
  testinator::BranchScope::~BranchScope((BranchScope *)local_e0);
  testinator::BranchScope::~BranchScope((BranchScope *)local_70);
  return true;
}

Assistant:

virtual bool Run()
  {
    DIAGNOSTIC("no branch");

    BRANCH(A)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    BRANCH(B)
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    return true;
  }